

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O1

int Kf_ManComputeRefs(Kf_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  float *pfVar5;
  float *pfVar6;
  Jf_Par_t *pJVar7;
  Gia_Man_t *pGVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  word *pwVar11;
  bool bVar12;
  float fVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  float fVar22;
  
  piVar4 = p->pGia->pRefs;
  if (piVar4 == (int *)0x0) {
    __assert_fail("p->pGia->pRefs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                  ,0x390,"int Kf_ManComputeRefs(Kf_Man_t *)");
  }
  pfVar5 = (p->vRefs).pArray;
  pfVar6 = (p->vArea).pArray;
  memset(piVar4,0,(long)p->pGia->nObjs << 2);
  pJVar7 = p->pPars;
  pJVar7->Area = 0;
  pJVar7->Edge = 0;
  pGVar8 = p->pGia;
  lVar15 = (long)pGVar8->nObjs;
  if (0 < lVar15) {
    do {
      if (pGVar8->nObjs < lVar15) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar9 = pGVar8->pObjs;
      if (pGVar9 == (Gia_Obj_t *)0x0) break;
      lVar16 = lVar15 + -1;
      uVar10 = *(ulong *)(pGVar9 + lVar16);
      uVar19 = (uint)uVar10;
      uVar18 = uVar10 & 0x1fffffff;
      if (((int)uVar19 < 0 && uVar18 != 0x1fffffff) ||
         (((-1 < (int)uVar19 && ((uVar19 & 0x1fffffff) != 0x1fffffff)) &&
          ((uVar19 & 0x1fffffff) == ((uint)(uVar10 >> 0x20) & 0x1fffffff))))) {
        pGVar1 = pGVar9 + lVar16 + -uVar18;
        if ((pGVar1 < pGVar9) || (pGVar9 + pGVar8->nObjs <= pGVar1)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        pGVar8->pRefs[(int)((ulong)((long)pGVar1 - (long)pGVar9) >> 2) * -0x55555555] =
             pGVar8->pRefs[(int)((ulong)((long)pGVar1 - (long)pGVar9) >> 2) * -0x55555555] + 1;
      }
      else if (((int)uVar18 != 0x1fffffff && -1 < (int)uVar19) &&
              (piVar4 = pGVar8->pRefs, 0 < piVar4[lVar16])) {
        if ((p->vCuts).nSize < lVar15) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar19 = (p->vCuts).pArray[lVar16];
        pwVar11 = (p->pMem).pPages[(int)uVar19 >> ((byte)(p->pMem).nPageSize & 0x1f)];
        lVar20 = (long)(int)(uVar19 & (p->pMem).uPageMask);
        lVar17 = (long)*(int *)((long)pwVar11 + lVar20 * 8 + 4);
        if (0 < *(int *)((long)pwVar11 + lVar17 * 4 + lVar20 * 8)) {
          lVar21 = 0;
          do {
            uVar19 = *(uint *)((long)pwVar11 + lVar21 * 4 + lVar17 * 4 + lVar20 * 8 + 4);
            if ((int)uVar19 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            piVar2 = piVar4 + (uVar19 >> 1);
            *piVar2 = *piVar2 + 1;
            lVar21 = lVar21 + 1;
          } while (lVar21 < *(int *)((long)pwVar11 + lVar17 * 4 + lVar20 * 8));
        }
        pJVar7->Edge = pJVar7->Edge + (long)*(int *)((long)pwVar11 + lVar17 * 4 + lVar20 * 8);
        pJVar7->Area = pJVar7->Area + 1;
      }
      bVar12 = 1 < lVar15;
      lVar15 = lVar16;
    } while (bVar12);
  }
  iVar14 = pGVar8->nObjs;
  if (0 < (long)iVar14) {
    iVar3 = pJVar7->fOptEdge;
    lVar15 = 0;
    do {
      if (iVar3 == 0) {
        fVar13 = (float)pGVar8->pRefs[lVar15] * 0.8;
        fVar22 = 0.2;
      }
      else {
        fVar13 = (float)pGVar8->pRefs[lVar15] * 0.2;
        fVar22 = 0.8;
      }
      fVar13 = pfVar5[lVar15] * fVar22 + fVar13;
      fVar22 = 1.0;
      if (1.0 <= fVar13) {
        fVar22 = fVar13;
      }
      pfVar6[lVar15] = (pfVar6[lVar15] * pfVar5[lVar15]) / fVar22;
      pfVar5[lVar15] = fVar22;
      if (pfVar6[lVar15] < 0.0) {
        __assert_fail("pFlow[i] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                      ,0x3a8,"int Kf_ManComputeRefs(Kf_Man_t *)");
      }
      lVar15 = lVar15 + 1;
    } while (iVar14 != lVar15);
  }
  iVar14 = Kf_ManComputeDelay(p,1);
  pJVar7 = p->pPars;
  pJVar7->Delay = (long)iVar14;
  return (int)pJVar7->Area;
}

Assistant:

int Kf_ManComputeRefs( Kf_Man_t * p )
{
    Gia_Obj_t * pObj; 
    float nRefsNew; int i, * pCut;
    float * pRefs = Vec_FltArray(&p->vRefs);
    float * pFlow = Vec_FltArray(&p->vArea);
    assert( p->pGia->pRefs != NULL );
    memset( p->pGia->pRefs, 0, sizeof(int) * Gia_ManObjNum(p->pGia) );
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachObjReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) || Gia_ObjIsBuf(pObj) )
            Gia_ObjRefInc( p->pGia, Gia_ObjFanin0(pObj) );
        else if ( Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p->pGia, pObj) > 0 )
        {
            pCut = Kf_ObjCutBest(p, i);
            Kf_CutRef( p, pCut );
            p->pPars->Edge += Kf_CutSize(pCut);
            p->pPars->Area++;
        }
    }
    // blend references and normalize flow
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
    {
        if ( p->pPars->fOptEdge )
            nRefsNew = Abc_MaxFloat( 1, 0.8 * pRefs[i] + 0.2 * p->pGia->pRefs[i] );
        else
            nRefsNew = Abc_MaxFloat( 1, 0.2 * pRefs[i] + 0.8 * p->pGia->pRefs[i] );
        pFlow[i] = pFlow[i] * pRefs[i] / nRefsNew;
        pRefs[i] = nRefsNew;
        assert( pFlow[i] >= 0 );
    }
    // compute delay
    p->pPars->Delay = Kf_ManComputeDelay( p, 1 );
    return p->pPars->Area;
}